

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O2

bool SetDiskInfo(uint8_t pb_,MGT_DISK_INFO *di)

{
  SamDosType SVar1;
  bool bVar2;
  undefined7 in_register_00000039;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string strPaddedLabel;
  
  uVar3 = CONCAT71(in_register_00000039,pb_) & 0xffffffff;
  SVar1 = di->dos_type;
  bVar2 = false;
  if (SVar1 == SAMDOS) {
    if ((di->disk_label)._M_string_length == 0) {
      return false;
    }
    if (opt.fix == 0) {
      return false;
    }
    if (opt.nosig != 0) {
      return false;
    }
    *(undefined4 *)(uVar3 + 0xe8) = 0x534f4442;
    di->dos_type = BDOS;
    bVar2 = true;
  }
  else if (SVar1 != BDOS) {
    if (SVar1 != MasterDOS) {
      return false;
    }
    *(undefined1 *)(uVar3 + 0xfc) = *(undefined1 *)((long)&di->serial_number + 1);
    *(char *)(uVar3 + 0xfd) = (char)di->serial_number;
    if ((di->disk_label)._M_string_length == 0) {
      *(undefined1 *)(uVar3 + 0xd2) = 0x2a;
      *(undefined8 *)(uVar3 + 0xd3) = 0x2020202020202020;
      *(undefined1 *)(uVar3 + 0xdb) = 0x20;
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_58,'\n');
      std::operator+(&strPaddedLabel,&di->disk_label,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      *(undefined2 *)(uVar3 + 0xda) = *(undefined2 *)(strPaddedLabel._M_dataplus._M_p + 8);
      *(undefined8 *)(uVar3 + 0xd2) = *(undefined8 *)strPaddedLabel._M_dataplus._M_p;
      std::__cxx11::string::~string((string *)&strPaddedLabel);
    }
    return false;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x10');
  std::operator+(&strPaddedLabel,&di->disk_label,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined2 *)(uVar3 + 0xda) = *(undefined2 *)(strPaddedLabel._M_dataplus._M_p + 8);
  *(undefined8 *)(uVar3 + 0xd2) = *(undefined8 *)strPaddedLabel._M_dataplus._M_p;
  *(undefined4 *)(uVar3 + 0xfa) = *(undefined4 *)(strPaddedLabel._M_dataplus._M_p + 10);
  *(undefined2 *)(uVar3 + 0xfe) = *(undefined2 *)(strPaddedLabel._M_dataplus._M_p + 0xe);
  std::__cxx11::string::~string((string *)&strPaddedLabel);
  return bVar2;
}

Assistant:

bool SetDiskInfo(uint8_t pb_, MGT_DISK_INFO& di)
{
    auto p = reinterpret_cast<MGT_DIR*>(pb_);
    auto modified = false;

    // Extract the remaining disk information from type-specific locations
    switch (di.dos_type)
    {
    case SamDosType::MasterDOS:
        // Set serial number
        p->extra.abSerial[0] = static_cast<uint8_t>(di.serial_number >> 8);
        p->extra.abSerial[1] = static_cast<uint8_t>(di.serial_number);

        // No label?
        if (di.disk_label.empty())
        {
            p->abLabel[0] = '*';
            memset(p->abLabel + 1, ' ', sizeof(p->abLabel) - 1);
        }
        else
        {
            std::string strPaddedLabel = di.disk_label + std::string(sizeof(p->abLabel), ' ');
            memcpy(p->abLabel, strPaddedLabel.data(), sizeof(p->abLabel));
        }
        break;

    case SamDosType::SAMDOS:
        // Leave as SAMDOS format if there's no label, or we're not allowed to write a BDOS signature
        if (di.disk_label.empty() || opt.fix == 0 || opt.nosig)
            break;

        // Convert to BDOS format
        memcpy(p->abBDOS, "BDOS", 4);
        di.dos_type = SamDosType::BDOS;
        modified = true;

        // fall through...

    case SamDosType::BDOS:
    {
        // Form space-padded version of the label
        std::string strPaddedLabel = di.disk_label + std::string(BDOS_LABEL_SIZE, ' ');

        // Split across the two locations used
        memcpy(p->abLabel, strPaddedLabel.data(), sizeof(p->abLabel));
        memcpy(&p->extra.bDirTag, strPaddedLabel.data() + sizeof(p->abLabel), 6);   // last 6 characters
        break;
    }
    }

    return modified;
}